

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
closest_gap(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
            *this,int pos)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  long in_RDI;
  uint64_t bitmap_left_gaps;
  uint64_t bitmap_right_gaps;
  int closest_left_gap_distance;
  int closest_right_gap_distance;
  uint64_t bitmap_data;
  int right_gap_pos_3;
  int i_1;
  int i;
  int left_gap_pos_2;
  int right_gap_pos_2;
  int right_gap_pos_1;
  int left_gap_pos_1;
  int right_gap_pos;
  int left_gap_pos;
  uint64_t right_bitmap_data;
  uint64_t left_bitmap_data;
  int bitmap_distance;
  int max_bidirectional_bitmap_offset;
  int max_right_bitmap_offset;
  int max_left_bitmap_offset;
  int right_bitmap_pos;
  int left_bitmap_pos;
  int bit_pos;
  int bitmap_pos;
  int local_e8;
  int local_e4;
  int local_d0;
  int local_cc;
  int local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c [4];
  int local_6c;
  undefined8 local_68;
  
  local_80 = *(int *)(in_RDI + 0x58) + -1;
  piVar3 = std::min<int>(local_7c,&local_80);
  local_7c[0] = *piVar3;
  local_94 = local_7c[0] >> 6;
  local_88 = local_7c[0] + local_94 * -0x40;
  if ((*(long *)(*(long *)(in_RDI + 0x60) + (long)local_94 * 8) == -1) ||
     ((local_94 == *(int *)(in_RDI + 0x68) + -1 &&
      (local_68 = *(undefined8 *)(*(long *)(in_RDI + 0x60) + (long)local_94 * 8),
      (int)POPCOUNT(local_68) == *(int *)(in_RDI + 0x58) + (*(int *)(in_RDI + 0x68) + -1) * -0x40)))
     ) {
    local_8c = 0;
    local_90 = *(int *)(in_RDI + 0x58) + -1 >> 6;
    local_98 = local_90 - local_94;
    local_84 = local_94;
    piVar3 = std::min<int>(&local_94,&local_98);
    for (local_a0 = 1; local_a0 <= *piVar3; local_a0 = local_a0 + 1) {
      uVar5 = *(ulong *)(*(long *)(in_RDI + 0x60) + (long)(local_84 - local_a0) * 8);
      uVar4 = *(ulong *)(*(long *)(in_RDI + 0x60) + (long)(local_84 + local_a0) * 8);
      if ((uVar5 != 0xffffffffffffffff) && (uVar4 != 0xffffffffffffffff)) {
        iVar1 = (((local_84 - local_a0) + 1) * 0x40 - (int)LZCOUNT(uVar5 ^ 0xffffffffffffffff)) + -1
        ;
        iVar2 = 0;
        for (uVar4 = uVar4 ^ 0xffffffffffffffff; (uVar4 & 1) == 0;
            uVar4 = uVar4 >> 1 | 0x8000000000000000) {
          iVar2 = iVar2 + 1;
        }
        iVar2 = (local_84 + local_a0) * 0x40 + iVar2;
        if (local_7c[0] - iVar1 <= iVar2 - local_7c[0]) {
          return iVar1;
        }
        if (*(int *)(in_RDI + 0x58) <= iVar2) {
          return iVar1;
        }
        return iVar2;
      }
      if (uVar5 != 0xffffffffffffffff) {
        iVar2 = (((local_84 - local_a0) + 1) * 0x40 - (int)LZCOUNT(uVar5 ^ 0xffffffffffffffff)) + -1
        ;
        if (local_88 < 0x21) {
          return iVar2;
        }
        if (*(int *)(in_RDI + 0x68) <= local_84 + local_a0 + 1) {
          return iVar2;
        }
        if (*(long *)(*(long *)(in_RDI + 0x60) + (long)(local_84 + local_a0 + 1) * 8) == -1) {
          return iVar2;
        }
        iVar1 = 0;
        for (uVar5 = *(ulong *)(*(long *)(in_RDI + 0x60) + (long)(local_84 + local_a0 + 1) * 8) ^
                     0xffffffffffffffff; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000)
        {
          iVar1 = iVar1 + 1;
        }
        iVar1 = (local_84 + local_a0 + 1) * 0x40 + iVar1;
        if (local_7c[0] - iVar2 <= iVar1 - local_7c[0]) {
          return iVar2;
        }
        if (*(int *)(in_RDI + 0x58) <= iVar1) {
          return iVar2;
        }
        return iVar1;
      }
      if (uVar4 != 0xffffffffffffffff) {
        iVar2 = 0;
        for (uVar4 = uVar4 ^ 0xffffffffffffffff; (uVar4 & 1) == 0;
            uVar4 = uVar4 >> 1 | 0x8000000000000000) {
          iVar2 = iVar2 + 1;
        }
        iVar2 = (local_84 + local_a0) * 0x40 + iVar2;
        if (iVar2 < *(int *)(in_RDI + 0x58)) {
          if (0x1f < local_88) {
            return iVar2;
          }
          if (local_84 - local_a0 < 1) {
            return iVar2;
          }
          if (*(long *)(*(long *)(in_RDI + 0x60) + (long)((local_84 - local_a0) + -1) * 8) == -1) {
            return iVar2;
          }
          iVar1 = ((local_84 - local_a0) * 0x40 -
                  (int)LZCOUNT(*(ulong *)(*(long *)(in_RDI + 0x60) +
                                         (long)((local_84 - local_a0) + -1) * 8) ^
                               0xffffffffffffffff)) + -1;
          if (local_7c[0] - iVar1 <= iVar2 - local_7c[0]) {
            return iVar1;
          }
          if (*(int *)(in_RDI + 0x58) <= iVar2) {
            return iVar1;
          }
          return iVar2;
        }
      }
    }
    if (local_98 < local_94) {
      for (local_cc = local_84 - local_a0; local_8c <= local_cc; local_cc = local_cc + -1) {
        if (*(long *)(*(long *)(in_RDI + 0x60) + (long)local_cc * 8) != -1) {
          return ((local_cc + 1) * 0x40 -
                 (int)LZCOUNT(*(ulong *)(*(long *)(in_RDI + 0x60) + (long)local_cc * 8) ^
                              0xffffffffffffffff)) + -1;
        }
      }
    }
    else {
      for (local_d0 = local_84 + local_a0; local_d0 <= local_90; local_d0 = local_d0 + 1) {
        if (*(long *)(*(long *)(in_RDI + 0x60) + (long)local_d0 * 8) != -1) {
          iVar2 = 0;
          for (uVar5 = *(ulong *)(*(long *)(in_RDI + 0x60) + (long)local_d0 * 8) ^
                       0xffffffffffffffff; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000
              ) {
            iVar2 = iVar2 + 1;
          }
          iVar2 = local_d0 * 0x40 + iVar2;
          if (iVar2 < *(int *)(in_RDI + 0x58)) {
            return iVar2;
          }
          return -1;
        }
      }
    }
    local_6c = -1;
  }
  else {
    uVar5 = *(ulong *)(*(long *)(in_RDI + 0x60) + (long)local_94 * 8);
    local_e4 = 0x40;
    local_e8 = 0x40;
    uVar4 = (uVar5 | (1L << ((byte)local_88 & 0x3f)) - 1U) ^ 0xffffffffffffffff;
    if (uVar4 == 0) {
      if (local_94 + 1 < *(int *)(in_RDI + 0x68)) {
        iVar2 = 0;
        for (uVar4 = *(ulong *)(*(long *)(in_RDI + 0x60) + (long)(local_94 + 1) * 8) ^
                     0xffffffffffffffff; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000)
        {
          iVar2 = iVar2 + 1;
        }
        local_e4 = (iVar2 + 0x40) - local_88;
      }
    }
    else {
      local_e4 = 0;
      for (; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x8000000000000000) {
        local_e4 = local_e4 + 1;
      }
      local_e4 = local_e4 - local_88;
    }
    uVar5 = (uVar5 ^ 0xffffffffffffffff) & (1L << ((byte)local_88 & 0x3f)) - 1U;
    if (uVar5 == 0) {
      if (0 < local_94) {
        local_e8 = local_88 +
                   (int)LZCOUNT(*(ulong *)(*(long *)(in_RDI + 0x60) + (long)(local_94 + -1) * 8) ^
                                0xffffffffffffffff) + 1;
      }
    }
    else {
      local_e8 = local_88 - (0x3f - (int)LZCOUNT(uVar5));
    }
    if ((local_e4 < local_e8) && (local_7c[0] + local_e4 < *(int *)(in_RDI + 0x58))) {
      local_6c = local_7c[0] + local_e4;
    }
    else {
      local_6c = local_7c[0] - local_e8;
    }
  }
  return local_6c;
}

Assistant:

int closest_gap(int pos) const {
    pos = std::min(pos, data_capacity_ - 1);
    int bitmap_pos = pos >> 6;
    int bit_pos = pos - (bitmap_pos << 6);
    if (bitmap_[bitmap_pos] == static_cast<uint64_t>(-1) ||
        (bitmap_pos == bitmap_size_ - 1 &&
         _mm_popcnt_u64(bitmap_[bitmap_pos]) ==
             data_capacity_ - ((bitmap_size_ - 1) << 6))) {
      // no gaps in this block of 64 positions, start searching in adjacent
      // blocks
      int left_bitmap_pos = 0;
      int right_bitmap_pos = ((data_capacity_ - 1) >> 6);  // inclusive
      int max_left_bitmap_offset = bitmap_pos - left_bitmap_pos;
      int max_right_bitmap_offset = right_bitmap_pos - bitmap_pos;
      int max_bidirectional_bitmap_offset =
          std::min<int>(max_left_bitmap_offset, max_right_bitmap_offset);
      int bitmap_distance = 1;
      while (bitmap_distance <= max_bidirectional_bitmap_offset) {
        uint64_t left_bitmap_data = bitmap_[bitmap_pos - bitmap_distance];
        uint64_t right_bitmap_data = bitmap_[bitmap_pos + bitmap_distance];
        if (left_bitmap_data != static_cast<uint64_t>(-1) &&
            right_bitmap_data != static_cast<uint64_t>(-1)) {
          int left_gap_pos = ((bitmap_pos - bitmap_distance + 1) << 6) -
                             static_cast<int>(_lzcnt_u64(~left_bitmap_data)) -
                             1;
          int right_gap_pos = ((bitmap_pos + bitmap_distance) << 6) +
                              static_cast<int>(_tzcnt_u64(~right_bitmap_data));
          if (pos - left_gap_pos <= right_gap_pos - pos ||
              right_gap_pos >= data_capacity_) {
            return left_gap_pos;
          } else {
            return right_gap_pos;
          }
        } else if (left_bitmap_data != static_cast<uint64_t>(-1)) {
          int left_gap_pos = ((bitmap_pos - bitmap_distance + 1) << 6) -
                             static_cast<int>(_lzcnt_u64(~left_bitmap_data)) -
                             1;
          // also need to check next block to the right
          if (bit_pos > 32 && bitmap_pos + bitmap_distance + 1 < bitmap_size_ &&
              bitmap_[bitmap_pos + bitmap_distance + 1] !=
                  static_cast<uint64_t>(-1)) {
            int right_gap_pos =
                ((bitmap_pos + bitmap_distance + 1) << 6) +
                static_cast<int>(
                    _tzcnt_u64(~bitmap_[bitmap_pos + bitmap_distance + 1]));
            if (pos - left_gap_pos <= right_gap_pos - pos ||
                right_gap_pos >= data_capacity_) {
              return left_gap_pos;
            } else {
              return right_gap_pos;
            }
          } else {
            return left_gap_pos;
          }
        } else if (right_bitmap_data != static_cast<uint64_t>(-1)) {
          int right_gap_pos = ((bitmap_pos + bitmap_distance) << 6) +
                              static_cast<int>(_tzcnt_u64(~right_bitmap_data));
          if (right_gap_pos < data_capacity_) {
            // also need to check next block to the left
            if (bit_pos < 32 && bitmap_pos - bitmap_distance > 0 &&
                bitmap_[bitmap_pos - bitmap_distance - 1] !=
                    static_cast<uint64_t>(-1)) {
              int left_gap_pos =
                  ((bitmap_pos - bitmap_distance) << 6) -
                  static_cast<int>(
                      _lzcnt_u64(~bitmap_[bitmap_pos - bitmap_distance - 1])) -
                  1;
              if (pos - left_gap_pos <= right_gap_pos - pos ||
                  right_gap_pos >= data_capacity_) {
                return left_gap_pos;
              } else {
                return right_gap_pos;
              }
            } else {
              return right_gap_pos;
            }
          }
        }
        bitmap_distance++;
      }
      if (max_left_bitmap_offset > max_right_bitmap_offset) {
        for (int i = bitmap_pos - bitmap_distance; i >= left_bitmap_pos; i--) {
          if (bitmap_[i] != static_cast<uint64_t>(-1)) {
            return ((i + 1) << 6) - static_cast<int>(_lzcnt_u64(~bitmap_[i])) -
                   1;
          }
        }
      } else {
        for (int i = bitmap_pos + bitmap_distance; i <= right_bitmap_pos; i++) {
          if (bitmap_[i] != static_cast<uint64_t>(-1)) {
            int right_gap_pos =
                (i << 6) + static_cast<int>(_tzcnt_u64(~bitmap_[i]));
            if (right_gap_pos >= data_capacity_) {
              return -1;
            } else {
              return right_gap_pos;
            }
          }
        }
      }
      return -1;
    } else {
      // search within block of 64 positions
      uint64_t bitmap_data = bitmap_[bitmap_pos];
      int closest_right_gap_distance = 64;
      int closest_left_gap_distance = 64;
      // Logically gaps to the right of pos, in the bitmap these are gaps to the
      // left of pos's bit
      // This covers the case where pos is a gap
      // For example, if pos is 3, then bitmap '10101101' -> bitmap_right_gaps
      // '01010000'
      uint64_t bitmap_right_gaps = ~(bitmap_data | ((1ULL << bit_pos) - 1));
      if (bitmap_right_gaps != 0) {
        closest_right_gap_distance =
            static_cast<int>(_tzcnt_u64(bitmap_right_gaps)) - bit_pos;
      } else if (bitmap_pos + 1 < bitmap_size_) {
        // look in the next block to the right
        closest_right_gap_distance =
            64 + static_cast<int>(_tzcnt_u64(~bitmap_[bitmap_pos + 1])) -
            bit_pos;
      }
      // Logically gaps to the left of pos, in the bitmap these are gaps to the
      // right of pos's bit
      // For example, if pos is 3, then bitmap '10101101' -> bitmap_left_gaps
      // '00000010'
      uint64_t bitmap_left_gaps = (~bitmap_data) & ((1ULL << bit_pos) - 1);
      if (bitmap_left_gaps != 0) {
        closest_left_gap_distance =
            bit_pos - (63 - static_cast<int>(_lzcnt_u64(bitmap_left_gaps)));
      } else if (bitmap_pos > 0) {
        // look in the next block to the left
        closest_left_gap_distance =
            bit_pos + static_cast<int>(_lzcnt_u64(~bitmap_[bitmap_pos - 1])) +
            1;
      }

      if (closest_right_gap_distance < closest_left_gap_distance &&
          pos + closest_right_gap_distance < data_capacity_) {
        return pos + closest_right_gap_distance;
      } else {
        return pos - closest_left_gap_distance;
      }
    }
  }